

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferDetail.hh
# Opt level: O0

void __thiscall
avro::detail::BufferImpl::extractData(BufferImpl *this,BufferImpl *dest,size_type bytes)

{
  reference pvVar1;
  size_type sVar2;
  ulong in_RDX;
  deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_> *in_RSI;
  long in_RDI;
  size_t excess;
  size_t currentSize;
  size_type bytesToExtract;
  value_type *in_stack_ffffffffffffffb8;
  deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_> *this_00;
  deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_> *in_stack_ffffffffffffffd0;
  ulong local_20;
  
  local_20 = in_RDX;
  while (local_20 != 0) {
    pvVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::front
                       (in_stack_ffffffffffffffd0);
    sVar2 = Chunk::dataSize(pvVar1);
    this_00 = in_RSI;
    std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::front
              (in_stack_ffffffffffffffd0);
    std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::push_back
              (this_00,in_stack_ffffffffffffffb8);
    if (local_20 < sVar2) {
      pvVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::front
                         (in_stack_ffffffffffffffd0);
      Chunk::truncateFront(pvVar1,local_20);
      in_stack_ffffffffffffffd0 =
           (deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_> *)(sVar2 - local_20);
      pvVar1 = std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::back
                         (in_stack_ffffffffffffffd0);
      Chunk::truncateBack(pvVar1,(size_type)in_stack_ffffffffffffffd0);
      local_20 = 0;
    }
    else {
      std::deque<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>::pop_front(this_00);
      local_20 = local_20 - sVar2;
    }
  }
  *(ulong *)(in_RDI + 0xa8) = *(long *)(in_RDI + 0xa8) - in_RDX;
  in_RSI[2].super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
  super__Deque_impl_data._M_map_size =
       in_RDX + in_RSI[2].
                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl
                .super__Deque_impl_data._M_map_size;
  return;
}

Assistant:

void extractData(BufferImpl &dest, size_type bytes)
    {
        assert(bytes && bytes <= size_);

        size_type bytesToExtract = bytes;
        while( bytesToExtract ) {
          
            size_t currentSize = readChunks_.front().dataSize();
            dest.readChunks_.push_back(readChunks_.front());

            // see if entire chunk was extracted 
            if(currentSize <= bytesToExtract) {
                readChunks_.pop_front();
                bytesToExtract -= currentSize;
            }
            else {
                readChunks_.front().truncateFront(bytesToExtract);
                size_t excess = currentSize - bytesToExtract;
                dest.readChunks_.back().truncateBack(excess);
                bytesToExtract = 0;
            }
        }

        size_ -= bytes;
        dest.size_ += bytes;
    }